

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkdiskcache.cpp
# Opt level: O2

void QNetworkDiskCache::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  (**(code **)(*(long *)_o + 0x98))();
  return;
}

Assistant:

void QNetworkDiskCache::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkDiskCache *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->clear(); break;
        default: ;
        }
    }
    (void)_a;
}